

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_is_reg(char *file,wchar_t line,char *pathname,wchar_t mode)

{
  int iVar1;
  uint in_ECX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t r;
  stat st;
  stat local_b8;
  uint local_24;
  char *local_20;
  wchar_t local_14;
  char *local_10;
  wchar_t local_4;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  assertion_count(in_RDI,in_ESI);
  iVar1 = lstat(local_20,&local_b8);
  if ((iVar1 == 0) && ((local_b8.st_mode & 0xf000) == 0x8000)) {
    if (((int)local_24 < 0) || (local_24 == (local_b8.st_mode & 0xfff))) {
      local_4 = L'\x01';
    }
    else {
      failure_start(local_10,(wchar_t)(ulong)(uint)local_14,"File %s has wrong mode",local_20);
      logprintf("  Expected: 0%3o\n",(ulong)local_24);
      logprintf("  Found: 0%3o\n",(ulong)(local_b8.st_mode & 0xfff));
      failure_finish((void *)0x10776e);
      local_4 = L'\0';
    }
  }
  else {
    failure_start(local_10,(wchar_t)(ulong)(uint)local_14,"File should exist: %s",local_20);
    failure_finish((void *)0x1076e4);
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

int
assertion_is_reg(const char *file, int line, const char *pathname, int mode)
{
	struct stat st;
	int r;

#if defined(_WIN32) && !defined(__CYGWIN__)
	(void)mode; /* UNUSED */
#endif
	assertion_count(file, line);
	r = lstat(pathname, &st);
	if (r != 0 || !S_ISREG(st.st_mode)) {
		failure_start(file, line, "File should exist: %s", pathname);
		failure_finish(NULL);
		return (0);
	}
#if !defined(_WIN32) || defined(__CYGWIN__)
	/* Windows doesn't handle permissions the same way as POSIX,
	 * so just ignore the mode tests. */
	/* TODO: Can we do better here? */
	if (mode >= 0 && (mode_t)mode != (st.st_mode & 07777)) {
		failure_start(file, line, "File %s has wrong mode", pathname);
		logprintf("  Expected: 0%3o\n", mode);
		logprintf("  Found: 0%3o\n", st.st_mode & 07777);
		failure_finish(NULL);
		return (0);
	}
#endif
	return (1);
}